

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

int Jf_ObjCutFilter(Jf_Man_t *p,Jf_Cut_t **pSto,int c)

{
  int iVar1;
  int local_28;
  int k;
  int c_local;
  Jf_Cut_t **pSto_local;
  Jf_Man_t *p_local;
  
  if (p->pPars->fCutMin == 0) {
    for (local_28 = 0; local_28 < c; local_28 = local_28 + 1) {
      if (((pSto[local_28]->pCut[0] <= pSto[c]->pCut[0]) &&
          ((pSto[c]->Sign & pSto[local_28]->Sign) == pSto[local_28]->Sign)) &&
         (iVar1 = Jf_CutIsContainedOrder(pSto[c]->pCut,pSto[local_28]->pCut), iVar1 != 0)) {
        return 0;
      }
    }
  }
  else {
    for (local_28 = 0; local_28 < c; local_28 = local_28 + 1) {
      if (((pSto[local_28]->pCut[0] <= pSto[c]->pCut[0]) &&
          ((pSto[c]->Sign & pSto[local_28]->Sign) == pSto[local_28]->Sign)) &&
         (iVar1 = Jf_CutIsContained1(pSto[c]->pCut,pSto[local_28]->pCut), iVar1 != 0)) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int Jf_ObjCutFilter( Jf_Man_t * p, Jf_Cut_t ** pSto, int c )
{
    int k;
    if ( p->pPars->fCutMin )
    {
        for ( k = 0; k < c; k++ )
            if ( pSto[c]->pCut[0] >= pSto[k]->pCut[0] && 
                (pSto[c]->Sign & pSto[k]->Sign) == pSto[k]->Sign && 
                 Jf_CutIsContained1(pSto[c]->pCut, pSto[k]->pCut) )
                 return 0;
    }
    else
    {
        for ( k = 0; k < c; k++ )
            if ( pSto[c]->pCut[0] >= pSto[k]->pCut[0] && 
                (pSto[c]->Sign & pSto[k]->Sign) == pSto[k]->Sign && 
                 Jf_CutIsContainedOrder(pSto[c]->pCut, pSto[k]->pCut) )
                 return 0;
    }
    return 1;
}